

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<std::function<void_()>,_0UL>::push_back
          (SmallVector<std::function<void_()>,_0UL> *this,function<void_()> *t)

{
  size_t *psVar1;
  size_t sVar2;
  undefined8 uVar3;
  function<void_()> *pfVar4;
  
  reserve(this,(this->super_VectorView<std::function<void_()>_>).buffer_size + 1);
  pfVar4 = (this->super_VectorView<std::function<void_()>_>).ptr;
  sVar2 = (this->super_VectorView<std::function<void_()>_>).buffer_size;
  *(undefined8 *)&pfVar4[sVar2].super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&pfVar4[sVar2].super__Function_base._M_functor + 8) = 0;
  pfVar4[sVar2].super__Function_base._M_manager = (_Manager_type)0x0;
  pfVar4[sVar2]._M_invoker = t->_M_invoker;
  if ((t->super__Function_base)._M_manager != (_Manager_type)0x0) {
    pfVar4 = pfVar4 + sVar2;
    uVar3 = *(undefined8 *)((long)&(t->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(pfVar4->super__Function_base)._M_functor =
         *(undefined8 *)&(t->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(pfVar4->super__Function_base)._M_functor + 8) = uVar3;
    (pfVar4->super__Function_base)._M_manager = (t->super__Function_base)._M_manager;
    (t->super__Function_base)._M_manager = (_Manager_type)0x0;
    t->_M_invoker = (_Invoker_type)0x0;
  }
  psVar1 = &(this->super_VectorView<std::function<void_()>_>).buffer_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}